

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_makeClosureWithCaptures
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionDefinitionOperand,
               size_t captureCount,int16_t *elementOperands)

{
  sysbvm_x86_register_t reg;
  int32_t offset;
  undefined6 in_register_00000032;
  undefined8 uVar1;
  size_t i;
  size_t sVar2;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister
              (jit,(sysbvm_x86_register_t)CONCAT62(in_register_00000032,resultOperand));
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionDefinitionOperand);
    sysbvm_jit_x86_call(jit,sysbvm_sequenceTuple_createForFunctionDefinition);
    uVar1 = 2;
    sysbvm_jit_x86_mov64Register(jit,SYSBVM_X86_64_ARG2,SYSBVM_X86_64_CALL_SHADOW_SPACE);
    offset = 0x10;
    for (sVar2 = 0; captureCount != sVar2; sVar2 = sVar2 + 1) {
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,elementOperands[sVar2]);
      uVar1 = 2;
      sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit,SYSBVM_X86_64_ARG2,offset,SYSBVM_X86_64_ARG1);
      offset = offset + 8;
    }
    sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)uVar1);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionDefinitionOperand);
    sysbvm_jit_x86_call(jit,sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeClosureWithCaptures(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionDefinitionOperand, size_t captureCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    // Make the capture vector.
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_sequenceTuple_createForFunctionDefinition);

    sysbvm_jit_x86_mov64Register(jit, SYSBVM_X86_64_ARG2, SYSBVM_X86_RAX);
    for(size_t i = 0; i < captureCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, elementOperands[i]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_64_ARG2, (int32_t) (sizeof(sysbvm_tuple_header_t) + i * sizeof(void*)), SYSBVM_X86_64_ARG1);
    }

    // Now construct the actual closure
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}